

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_expect_uint_match(mpack_reader_t *reader,uint64_t value)

{
  uint64_t uVar1;
  uint64_t value_local;
  mpack_reader_t *reader_local;
  
  uVar1 = mpack_expect_u64(reader);
  if (uVar1 != value) {
    mpack_reader_flag_error(reader,mpack_error_type);
  }
  return;
}

Assistant:

void mpack_expect_uint_match(mpack_reader_t* reader, uint64_t value) {
    if (mpack_expect_u64(reader) != value)
        mpack_reader_flag_error(reader, mpack_error_type);
}